

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanojson3.h
# Opt level: O1

void __thiscall
nanojson3::json::
json_writer<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::write_element(json_writer<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *this,js_string *val)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  long lVar2;
  js_string_view val_00;
  string_view sVar3;
  char buf [32];
  char acStack_48 [32];
  
  if ((this->option_bits_ & debug_dump_type_as_comment) != default_option) {
    pbVar1 = (this->output_).it_.container;
    lVar2 = 0;
    do {
      std::__cxx11::string::push_back((char)pbVar1);
      lVar2 = lVar2 + 1;
    } while (lVar2 != 0xd);
    sVar3 = integer_to_chars<32UL,_unsigned_long,_nullptr>(&acStack_48,val->_M_string_length);
    if (0 < (long)sVar3._M_len) {
      pbVar1 = (this->output_).it_.container;
      lVar2 = sVar3._M_len + 1;
      do {
        std::__cxx11::string::push_back((char)pbVar1);
        lVar2 = lVar2 + -1;
      } while (1 < lVar2);
    }
    pbVar1 = (this->output_).it_.container;
    lVar2 = 0;
    do {
      std::__cxx11::string::push_back((char)pbVar1);
      lVar2 = lVar2 + 1;
    } while (lVar2 != 8);
  }
  val_00._M_str = (val->_M_dataplus)._M_p;
  val_00._M_len = val->_M_string_length;
  write_string(this,val_00);
  return;
}

Assistant:

void write_element(const js_string& val)
        {
            using namespace std::string_view_literals;
            if (has_option(json_serialize_option::debug_dump_type_as_comment))
            {
                char buf[32];
                output_ << "/***  STRING["sv << integer_to_chars(buf, val.size()) << "]  ***/ "sv;
            }

            write_string(val);
        }